

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

void Acb_Ntk4CollectRing(Acb_Ntk_t *pNtk,Vec_Int_t *vStart,Vec_Int_t *vRes,Vec_Int_t *vDists)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Acb_ObjType_t AVar4;
  int iVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  int Weight;
  int *pFanins;
  int iFanin;
  int k;
  int iObj;
  int i;
  Vec_Int_t *vDists_local;
  Vec_Int_t *vRes_local;
  Vec_Int_t *vStart_local;
  Acb_Ntk_t *pNtk_local;
  
  for (k = 0; iVar1 = Vec_IntSize(vStart), k < iVar1; k = k + 1) {
    iVar1 = Vec_IntEntry(vStart,k);
    iVar2 = Vec_IntEntry(vDists,iVar1);
    pFanins._4_4_ = 0;
    piVar6 = Acb_ObjFanins(pNtk,iVar1);
    for (; pFanins._4_4_ < *piVar6; pFanins._4_4_ = pFanins._4_4_ + 1) {
      iVar3 = piVar6[pFanins._4_4_ + 1];
      iVar5 = Acb_ObjFaninNum(pNtk,iVar1);
      Acb_Ntk4CollectAdd(pNtk,iVar3,vRes,vDists,iVar2 + (uint)(1 < iVar5));
    }
    pFanins._4_4_ = 0;
    while( true ) {
      pVVar7 = Vec_WecEntry(&pNtk->vFanouts,iVar1);
      iVar3 = Vec_IntSize(pVVar7);
      if (iVar3 <= pFanins._4_4_) break;
      pVVar7 = Vec_WecEntry(&pNtk->vFanouts,iVar1);
      iVar3 = Vec_IntEntry(pVVar7,pFanins._4_4_);
      AVar4 = Acb_ObjType(pNtk,iVar3);
      if (AVar4 != ABC_OPER_NONE) {
        iVar5 = Acb_ObjFaninNum(pNtk,iVar1);
        Acb_Ntk4CollectAdd(pNtk,iVar3,vRes,vDists,iVar2 + (uint)(1 < iVar5) * 2);
      }
      pFanins._4_4_ = pFanins._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void Acb_Ntk4CollectRing( Acb_Ntk_t * pNtk, Vec_Int_t * vStart, Vec_Int_t * vRes, Vec_Int_t * vDists )
{
    int i, iObj;
    Vec_IntForEachEntry( vStart, iObj, i )
    {
        int k, iFanin, * pFanins, Weight = Vec_IntEntry(vDists, iObj); 
        Acb_ObjForEachFaninFast( pNtk, iObj, pFanins, iFanin, k )
            Acb_Ntk4CollectAdd( pNtk, iFanin, vRes, vDists, Weight + 1*(Acb_ObjFaninNum(pNtk, iObj) > 1) );
        Acb_ObjForEachFanout( pNtk, iObj, iFanin, k )
            Acb_Ntk4CollectAdd( pNtk, iFanin, vRes, vDists, Weight + 2*(Acb_ObjFaninNum(pNtk, iObj) > 1) );
    }
}